

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O1

size_t derTEnc(octet *der,u32 tag)

{
  bool bVar1;
  bool_t bVar2;
  long lVar3;
  size_t sVar4;
  size_t sVar5;
  uint uVar6;
  
  bVar2 = derTIsValid(tag);
  if (bVar2 == 0) {
    sVar4 = 0xffffffffffffffff;
  }
  else {
    lVar3 = 0;
    uVar6 = tag;
    if (tag != 0) {
      do {
        lVar3 = lVar3 + 1;
        bVar1 = 0xff < uVar6;
        uVar6 = uVar6 >> 8;
      } while (bVar1);
    }
    sVar4 = lVar3 + (ulong)(lVar3 == 0);
    sVar5 = sVar4;
    if (der != (octet *)0x0) {
      do {
        der[sVar5 - 1] = (octet)tag;
        sVar5 = sVar5 - 1;
        tag = tag >> 8;
      } while (sVar5 != 0);
    }
  }
  return sVar4;
}

Assistant:

static size_t derTEnc(octet der[], u32 tag)
{
	size_t t_count = 0;
	// проверить корректность
	if (!derTIsValid(tag))
		return SIZE_MAX;
	// определить длину кода
	{
		u32 t = tag;
		for (; t; ++t_count, t >>= 8);
		if (t_count == 0)
			t_count = 1;
	}
	// кодировать
	if (der)
	{
		size_t pos = t_count;
		ASSERT(memIsValid(der, t_count));
		while (pos--)
		{
			der[pos] = (octet)tag;
			tag >>= 8;
		}
		ASSERT(tag == 0);
	}
	return t_count;
}